

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O3

void __thiscall Poll::notify_subscriber_changed(Poll *this,Subscriber *listener)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  pointer ppVar5;
  
  bVar1 = Subscriber::is_dirty(listener);
  if (bVar1) {
    iVar3 = Subscriber::get_fd(listener);
    iVar4 = -iVar3;
    if (0 < iVar3) {
      iVar4 = iVar3;
    }
    for (ppVar5 = (this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppVar5 != (this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                  super__Vector_impl_data._M_finish; ppVar5 = ppVar5 + 1) {
      if (ppVar5->fd == iVar4) {
        iVar4 = Subscriber::get_fd(listener);
        ppVar5->fd = iVar4;
        sVar2 = Subscriber::get_mask(listener);
        ppVar5->events = sVar2;
        Subscriber::set_dirty(listener,false);
        return;
      }
    }
  }
  return;
}

Assistant:

void Poll::notify_subscriber_changed(Subscriber &listener) {
  if (!listener.is_dirty()) return;
  int initial_fd = abs(listener.get_fd());
  for (auto &fd: fds) {
    if (fd.fd == initial_fd) {
      fd.fd = listener.get_fd();
      fd.events = listener.get_mask();
      listener.set_dirty(false);
      break;
    }
  }
}